

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O0

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::AppendForExperts
          (ON_SubDComponentRefList *this,ON_SubD *subd,ON_COMPONENT_INDEX ci,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubDRef local_48;
  ON__UINT_PTR local_38;
  ON__UINT_PTR reference_id_local;
  ON_SubD *pOStack_28;
  ON_SubDComponentLocation component_location_local;
  ON_SubD *subd_local;
  ON_SubDComponentRefList *this_local;
  ON_COMPONENT_INDEX ci_local;
  
  local_38 = reference_id;
  reference_id_local._7_1_ = component_location;
  pOStack_28 = subd;
  subd_local = (ON_SubD *)this;
  this_local = (ON_SubDComponentRefList *)ci;
  bVar1 = ON_SubD::IsEmpty(subd);
  if (bVar1) {
    ci_local = (ON_COMPONENT_INDEX)&ON_SubDComponentRef::Empty;
  }
  else {
    ON_SubDRef::CreateReferenceForExperts(&local_48,pOStack_28);
    ci_local = (ON_COMPONENT_INDEX)
               Append(this,&local_48,(ON_COMPONENT_INDEX)this_local,reference_id_local._7_1_,
                      local_38);
    ON_SubDRef::~ON_SubDRef(&local_48);
  }
  return (ON_SubDComponentRef *)ci_local;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::AppendForExperts(
  const ON_SubD& subd,
  ON_COMPONENT_INDEX ci,
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
)
{
  for (;;)
  {
    if (subd.IsEmpty())
      break;
    return Append(ON_SubDRef::CreateReferenceForExperts(subd),ci,component_location,reference_id);
  }
  return ON_SubDComponentRef::Empty;
}